

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O0

string * __thiscall ZXing::Result::sequenceId_abi_cxx11_(Result *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0xa0));
  return in_RDI;
}

Assistant:

std::string Result::sequenceId() const
{
	return _sai.id;
}